

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWS::Element::Parse(Element *this,char **buffer)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Logger *this_00;
  byte *pbVar4;
  Element local_88;
  
  do {
    bVar2 = SkipSpacesAndLineEnd<char>(buffer);
    if (!bVar2) {
      return;
    }
    cVar1 = **buffer;
    if (cVar1 == '{') {
      *buffer = *buffer + 1;
      SkipSpaces<char>(buffer);
    }
    else if (cVar1 == '}') {
      return;
    }
    Element(&local_88);
    std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::push_back
              (&this->children,&local_88);
    ~Element(&local_88);
    pbVar4 = (byte *)*buffer;
    while ((0x20 < (ulong)*pbVar4 || ((0x100003601U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))) {
      pbVar4 = pbVar4 + 1;
      *buffer = (char *)pbVar4;
    }
    local_88.tokens[0]._M_dataplus._M_p = (pointer)&local_88.tokens[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
    std::__cxx11::string::operator=
              ((string *)
               ((this->children).
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                _M_impl._M_node.super__List_node_base._M_prev + 1),(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    SkipSpaces<char>(buffer);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((this->children).
                             super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),"Plugin");
    if (bVar2) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,"LWS: Skipping over plugin-specific data");
      while ((bVar2 = SkipSpacesAndLineEnd<char>(buffer), bVar2 &&
             (iVar3 = strncmp(*buffer,"EndPlugin",9), iVar3 != 0))) {
        SkipLine<char>(buffer);
      }
    }
    else {
      pbVar4 = (byte *)*buffer;
      while ((0xd < *pbVar4 || ((0x3401U >> (*pbVar4 & 0x1f) & 1) == 0))) {
        pbVar4 = pbVar4 + 1;
        *buffer = (char *)pbVar4;
      }
      local_88.tokens[0]._M_dataplus._M_p = (pointer)&local_88.tokens[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
      std::__cxx11::string::operator=
                ((string *)
                 ((this->children).
                  super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                  _M_impl._M_node.super__List_node_base._M_prev + 3),(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (cVar1 == '{') {
        Parse((Element *)
              ((this->children).
               super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl
               ._M_node.super__List_node_base._M_prev + 1),buffer);
      }
    }
    SkipLine<char>(buffer);
  } while( true );
}

Assistant:

void LWS::Element::Parse (const char*& buffer)
{
    for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {

        // begin of a new element with children
        bool sub = false;
        if (*buffer == '{') {
            ++buffer;
            SkipSpaces(&buffer);
            sub = true;
        }
        else if (*buffer == '}')
            return;

        children.push_back(Element());

        // copy data line - read token per token

        const char* cur = buffer;
        while (!IsSpaceOrNewLine(*buffer)) ++buffer;
        children.back().tokens[0] = std::string(cur,(size_t) (buffer-cur));
        SkipSpaces(&buffer);

        if (children.back().tokens[0] == "Plugin")
        {
            ASSIMP_LOG_DEBUG("LWS: Skipping over plugin-specific data");

            // strange stuff inside Plugin/Endplugin blocks. Needn't
            // follow LWS syntax, so we skip over it
            for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {
                if (!::strncmp(buffer,"EndPlugin",9)) {
                    //SkipLine(&buffer);
                    break;
                }
            }
            continue;
        }

        cur = buffer;
        while (!IsLineEnd(*buffer)) ++buffer;
        children.back().tokens[1] = std::string(cur,(size_t) (buffer-cur));

        // parse more elements recursively
        if (sub)
            children.back().Parse(buffer);
    }
}